

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

NumberParserImpl * __thiscall
icu_63::DecimalFormat::getCurrencyParser(DecimalFormat *this,UErrorCode *status)

{
  atomic<icu_63::numparse::impl::NumberParserImpl_*> *paVar1;
  NumberParserImpl *pNVar2;
  NumberParserImpl *pNVar3;
  bool bVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pNVar2 = (this->fields->atomicCurrencyParser)._M_b._M_p;
    if (pNVar2 == (NumberParserImpl *)0x0) {
      pNVar2 = numparse::impl::NumberParserImpl::createParserFromProperties
                         ((this->fields->properties).
                          super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                          (this->fields->symbols).
                          super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,true,status
                         );
      if (pNVar2 == (NumberParserImpl *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        paVar1 = &this->fields->atomicCurrencyParser;
        LOCK();
        pNVar3 = (paVar1->_M_b)._M_p;
        bVar4 = pNVar3 == (NumberParserImpl *)0x0;
        if (bVar4) {
          (paVar1->_M_b)._M_p = (__pointer_type)0x0;
          pNVar3 = (NumberParserImpl *)0x0;
        }
        UNLOCK();
        pNVar2 = (NumberParserImpl *)0x0;
        if (!bVar4) {
          pNVar2 = pNVar3;
        }
      }
      else {
        paVar1 = &this->fields->atomicCurrencyParser;
        LOCK();
        pNVar3 = (paVar1->_M_b)._M_p;
        bVar4 = pNVar3 == (NumberParserImpl *)0x0;
        if (bVar4) {
          (paVar1->_M_b)._M_p = pNVar2;
          pNVar3 = (NumberParserImpl *)0x0;
        }
        UNLOCK();
        if (!bVar4) {
          (*(pNVar2->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
          pNVar2 = pNVar3;
        }
      }
    }
  }
  else {
    pNVar2 = (NumberParserImpl *)0x0;
  }
  return pNVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }